

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall
cppcms::widgets::select_multiple::element::element(element *this,string *val,string *msg,bool sel)

{
  undefined7 in_register_00000009;
  
  *(uint *)this = (int)CONCAT71(in_register_00000009,sel) * 5 | *(uint *)this & 0xfffffff8;
  std::__cxx11::string::string((string *)&this->id,(string *)val);
  std::__cxx11::string::string((string *)&this->str_option,(string *)msg);
  booster::locale::basic_message<char>::basic_message(&this->tr_option);
  return;
}

Assistant:

select_multiple::element::element(std::string const &val,std::string const &msg,bool sel) :
	selected(sel),
	need_translation(0),
	original_select(sel),
	id(val),
	str_option(msg)
{
}